

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O2

int __thiscall TinyProcessLib::Process::get_exit_status(Process *this)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  int *__stat_loc;
  int exit_status;
  
  if ((this->data).id < 1) {
    iVar2 = -1;
  }
  else {
    __stat_loc = &exit_status;
    do {
      _Var1 = waitpid((this->data).id,__stat_loc,0);
      if (-1 < _Var1) goto LAB_00158571;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    if (*piVar3 == 10) {
      __stat_loc = &(this->data).exit_status;
    }
    else {
LAB_00158571:
      if (0xff < exit_status) {
        exit_status = (uint)exit_status >> 8;
      }
      (this->data).exit_status = exit_status;
      std::mutex::lock(&this->close_mutex);
      this->closed = true;
      pthread_mutex_unlock((pthread_mutex_t *)&this->close_mutex);
      close_fds(this);
    }
    iVar2 = *__stat_loc;
  }
  return iVar2;
}

Assistant:

int Process::get_exit_status() noexcept {
  if(data.id <= 0)
    return -1;

  int exit_status;
  id_type p;
  do
  {
    p = waitpid(data.id, &exit_status, 0);
  }
  while(p < 0 && errno == EINTR);

  if(p < 0 && errno == ECHILD) {
    // PID doesn't exist anymore, return previously sampled exit status (or -1)
    return data.exit_status;
  }
  else {
    // store exit status for future calls
    if(exit_status >= 256)
      exit_status = exit_status >> 8;
    data.exit_status = exit_status;
  }

  {
    std::lock_guard<std::mutex> lock(close_mutex);
    closed = true;
  }
  close_fds();

  return exit_status;
}